

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::sampleTextureLayer
          (LayeredRenderCase *this,Surface *dst,int layer)

{
  ostringstream *this_00;
  RenderContext *context;
  int iVar1;
  undefined4 uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar5;
  undefined4 extraout_var_01;
  void *data;
  Buffer buf;
  VertexArray vao;
  TextureFormat local_1e8;
  ObjectWrapper local_1e0;
  ObjectWrapper local_1c8;
  undefined1 local_1b0 [384];
  long lVar4;
  
  if ((anonymous_namespace)::LayeredRenderCase::sampleTextureLayer(tcu::Surface&,int)::
      fullscreenQuad == '\0') {
    _GLOBAL__N_1::LayeredRenderCase::sampleTextureLayer();
  }
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar4 + 0x780))((this->m_samplerShader->m_program).m_program,"a_position");
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar5 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1c8,(Functions *)CONCAT44(extraout_var_00,iVar1),pOVar5);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar5 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1e0,(Functions *)CONCAT44(extraout_var_01,iVar1),pOVar5);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Sampling from texture layer ",0x1c);
  std::ostream::operator<<(this_00,layer);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar4 + 0x188))(0x4000);
  (**(code **)(lVar4 + 0x1a00))
            (0,0,(this->m_resolveDimensions).m_data[0],(this->m_resolveDimensions).m_data[1]);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd4f);
  (**(code **)(lVar4 + 0x40))(0x8892,local_1e0.m_object);
  (**(code **)(lVar4 + 0x150))(0x8892,0x40,sampleTextureLayer::fullscreenQuad,0x88e4);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd53);
  (**(code **)(lVar4 + 0xd8))(local_1c8.m_object);
  (**(code **)(lVar4 + 0x19f0))(uVar2,4,0x1406,0,0,0);
  (**(code **)(lVar4 + 0x610))(uVar2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd58);
  (**(code **)(lVar4 + 8))(0x84c0);
  uVar2 = 0;
  if ((ulong)this->m_target < 5) {
    uVar2 = *(undefined4 *)(&DAT_009467a4 + (ulong)this->m_target * 4);
  }
  (**(code **)(lVar4 + 0xb8))(uVar2,this->m_texture);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"bind texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd5c);
  (**(code **)(lVar4 + 0x1680))((this->m_samplerShader->m_program).m_program);
  (**(code **)(lVar4 + 0x14f0))(this->m_samplerLayerLoc,layer);
  (**(code **)(lVar4 + 0x14f0))(this->m_samplerSamplerLoc,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd61);
  (**(code **)(lVar4 + 0x538))(5,0,4);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd64);
  (**(code **)(lVar4 + 0x1680))(0);
  (**(code **)(lVar4 + 0xd8))(0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xd68);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1e8.order = RGBA;
  local_1e8.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1e8,dst->m_width,dst->m_height,1,data);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  glu::ObjectWrapper::~ObjectWrapper(&local_1e0);
  glu::ObjectWrapper::~ObjectWrapper(&local_1c8);
  return;
}

Assistant:

void LayeredRenderCase::sampleTextureLayer (tcu::Surface& dst, int layer)
{
	DE_ASSERT(dst.getWidth() == m_resolveDimensions.x());
	DE_ASSERT(dst.getHeight() == m_resolveDimensions.y());

	static const tcu::Vec4 fullscreenQuad[4] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				positionLoc	= gl.getAttribLocation(m_samplerShader->getProgram(), "a_position");
	glu::VertexArray		vao			(m_context.getRenderContext());
	glu::Buffer				buf			(m_context.getRenderContext());

	m_testCtx.getLog() << tcu::TestLog::Message << "Sampling from texture layer " << layer << tcu::TestLog::EndMessage;

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.viewport(0, 0, m_resolveDimensions.x(), m_resolveDimensions.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindBuffer(GL_ARRAY_BUFFER, *buf);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buf");

	gl.bindVertexArray(*vao);
	gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(positionLoc);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(getTargetTextureTarget(m_target), m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind texture");

	gl.useProgram(m_samplerShader->getProgram());
	gl.uniform1i(m_samplerLayerLoc, layer);
	gl.uniform1i(m_samplerSamplerLoc, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup program");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	gl.useProgram(0);
	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}